

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ExtensionSet::MergeFrom(ExtensionSet *this,ExtensionSet *other)

{
  Extension *pEVar1;
  bool bVar2;
  byte bVar3;
  CppType CVar4;
  int iVar5;
  LogMessage *pLVar6;
  RepeatedField<int> *pRVar7;
  RepeatedField<unsigned_long> *this_00;
  MessageLite *pMVar8;
  Type *pTVar9;
  Type *value;
  undefined4 extraout_var;
  RepeatedField<long> *this_01;
  RepeatedField<unsigned_int> *this_02;
  RepeatedField<bool> *this_03;
  RepeatedField<double> *this_04;
  RepeatedField<float> *this_05;
  string *this_06;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  int *piVar12;
  int i;
  int index;
  _Rb_tree_node_base *p_Var13;
  LogFinisher local_81;
  ExtensionSet *local_80;
  Extension *extension;
  LogMessage local_70;
  _Rb_tree_node_base *local_38;
  
  p_Var10 = (other->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var13 = &(other->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_80 = this;
  local_38 = p_Var13;
  do {
    if (p_Var10 == p_Var13) {
      return;
    }
    if (*(char *)((long)&p_Var10[1]._M_left + 1) == '\x01') {
      bVar2 = MaybeNewExtension(local_80,p_Var10[1]._M_color,(FieldDescriptor *)p_Var10[1]._M_right,
                                &extension);
      pEVar1 = extension;
      if (bVar2) {
        extension->type = *(FieldType *)&p_Var10[1]._M_left;
        extension->is_packed = *(bool *)((long)&p_Var10[1]._M_left + 3);
        extension->is_repeated = true;
      }
      else {
        if (extension->type != *(FieldType *)&p_Var10[1]._M_left) {
          LogMessage::LogMessage
                    (&local_70,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                     ,0x2ba);
          pLVar6 = LogMessage::operator<<
                             (&local_70,
                              "CHECK failed: (extension->type) == (other_extension.type): ");
          LogFinisher::operator=(&local_81,pLVar6);
          LogMessage::~LogMessage(&local_70);
        }
        if (pEVar1->is_packed != (bool)*(char *)((long)&p_Var10[1]._M_left + 3)) {
          LogMessage::LogMessage
                    (&local_70,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                     ,699);
          pLVar6 = LogMessage::operator<<
                             (&local_70,
                              "CHECK failed: (extension->is_packed) == (other_extension.is_packed): "
                             );
          LogFinisher::operator=(&local_81,pLVar6);
          LogMessage::~LogMessage(&local_70);
        }
        if (pEVar1->is_repeated == false) {
          LogMessage::LogMessage
                    (&local_70,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                     ,700);
          pLVar6 = LogMessage::operator<<(&local_70,"CHECK failed: extension->is_repeated: ");
          LogFinisher::operator=(&local_81,pLVar6);
          LogMessage::~LogMessage(&local_70);
        }
      }
      CVar4 = anon_unknown_0::cpp_type(*(FieldType *)&p_Var10[1]._M_left);
      p_Var13 = local_38;
      switch(CVar4) {
      case CPPTYPE_INT32:
      case CPPTYPE_ENUM:
        if (bVar2) {
          pRVar7 = (RepeatedField<int> *)operator_new(0x10);
          pRVar7->elements_ = (int *)0x0;
          pRVar7->current_size_ = 0;
          pRVar7->total_size_ = 0;
          (pEVar1->field_0).repeated_string_value =
               (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)pRVar7;
        }
        else {
          pRVar7 = (pEVar1->field_0).repeated_int32_value;
        }
        RepeatedField<int>::MergeFrom(pRVar7,(RepeatedField<int> *)p_Var10[1]._M_parent);
        p_Var13 = local_38;
        break;
      case CPPTYPE_INT64:
        if (bVar2) {
          this_01 = (RepeatedField<long> *)operator_new(0x10);
          this_01->elements_ = (long *)0x0;
          this_01->current_size_ = 0;
          this_01->total_size_ = 0;
          (pEVar1->field_0).repeated_string_value =
               (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this_01;
        }
        else {
          this_01 = (pEVar1->field_0).repeated_int64_value;
        }
        RepeatedField<long>::MergeFrom(this_01,(RepeatedField<long> *)p_Var10[1]._M_parent);
        p_Var13 = local_38;
        break;
      case CPPTYPE_UINT32:
        if (bVar2) {
          this_02 = (RepeatedField<unsigned_int> *)operator_new(0x10);
          this_02->elements_ = (uint *)0x0;
          this_02->current_size_ = 0;
          this_02->total_size_ = 0;
          (pEVar1->field_0).repeated_string_value =
               (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this_02;
        }
        else {
          this_02 = (pEVar1->field_0).repeated_uint32_value;
        }
        RepeatedField<unsigned_int>::MergeFrom
                  (this_02,(RepeatedField<unsigned_int> *)p_Var10[1]._M_parent);
        p_Var13 = local_38;
        break;
      case CPPTYPE_UINT64:
        if (bVar2) {
          this_00 = (RepeatedField<unsigned_long> *)operator_new(0x10);
          this_00->elements_ = (unsigned_long *)0x0;
          this_00->current_size_ = 0;
          this_00->total_size_ = 0;
          (pEVar1->field_0).repeated_string_value =
               (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this_00;
        }
        else {
          this_00 = (pEVar1->field_0).repeated_uint64_value;
        }
        RepeatedField<unsigned_long>::MergeFrom
                  (this_00,(RepeatedField<unsigned_long> *)p_Var10[1]._M_parent);
        p_Var13 = local_38;
        break;
      case CPPTYPE_DOUBLE:
        if (bVar2) {
          this_04 = (RepeatedField<double> *)operator_new(0x10);
          this_04->elements_ = (double *)0x0;
          this_04->current_size_ = 0;
          this_04->total_size_ = 0;
          (pEVar1->field_0).repeated_string_value =
               (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this_04;
        }
        else {
          this_04 = (pEVar1->field_0).repeated_double_value;
        }
        RepeatedField<double>::MergeFrom(this_04,(RepeatedField<double> *)p_Var10[1]._M_parent);
        p_Var13 = local_38;
        break;
      case CPPTYPE_FLOAT:
        if (bVar2) {
          this_05 = (RepeatedField<float> *)operator_new(0x10);
          this_05->elements_ = (float *)0x0;
          this_05->current_size_ = 0;
          this_05->total_size_ = 0;
          (pEVar1->field_0).repeated_string_value =
               (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this_05;
        }
        else {
          this_05 = (pEVar1->field_0).repeated_float_value;
        }
        RepeatedField<float>::MergeFrom(this_05,(RepeatedField<float> *)p_Var10[1]._M_parent);
        p_Var13 = local_38;
        break;
      case CPPTYPE_BOOL:
        if (bVar2) {
          this_03 = (RepeatedField<bool> *)operator_new(0x10);
          this_03->elements_ = (bool *)0x0;
          this_03->current_size_ = 0;
          this_03->total_size_ = 0;
          (pEVar1->field_0).repeated_string_value =
               (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this_03;
        }
        else {
          this_03 = (pEVar1->field_0).repeated_bool_value;
        }
        RepeatedField<bool>::MergeFrom(this_03,(RepeatedField<bool> *)p_Var10[1]._M_parent);
        p_Var13 = local_38;
        break;
      case CPPTYPE_STRING:
        if (bVar2) {
          this_06 = (string *)operator_new(0x18);
          (this_06->_M_dataplus)._M_p = (pointer)0x0;
          this_06->_M_string_length = 0;
          *(int *)&this_06->field_2 = 0;
          (pEVar1->field_0).repeated_string_value =
               (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this_06;
        }
        else {
          this_06 = (pEVar1->field_0).string_value;
        }
        RepeatedPtrFieldBase::
        MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                  ((RepeatedPtrFieldBase *)this_06,(RepeatedPtrFieldBase *)p_Var10[1]._M_parent);
        p_Var13 = local_38;
        break;
      case CPPTYPE_MESSAGE:
        if (bVar2) {
          pMVar8 = (MessageLite *)operator_new(0x18);
          pMVar8->_vptr_MessageLite = (_func_int **)0x0;
          pMVar8[1]._vptr_MessageLite = (_func_int **)0x0;
          *(undefined4 *)&pMVar8[2]._vptr_MessageLite = 0;
          (pEVar1->field_0).message_value = pMVar8;
        }
        p_Var11 = p_Var10[1]._M_parent;
        for (index = 0; p_Var13 = local_38, index < *(int *)&p_Var11->_M_parent; index = index + 1)
        {
          pTVar9 = RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                             ((RepeatedPtrFieldBase *)p_Var11,index);
          value = RepeatedPtrFieldBase::
                  AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                            ((RepeatedPtrFieldBase *)(pEVar1->field_0).string_value);
          if (value == (Type *)0x0) {
            iVar5 = (*pTVar9->_vptr_MessageLite[3])(pTVar9);
            value = (Type *)CONCAT44(extraout_var,iVar5);
            RepeatedPtrFieldBase::
            AddAllocated<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(pEVar1->field_0).string_value,value);
          }
          (*value->_vptr_MessageLite[7])(value,pTVar9);
        }
      }
    }
    else if (((ulong)p_Var10[1]._M_left & 0x10000) == 0) {
      CVar4 = anon_unknown_0::cpp_type(*(FieldType *)&p_Var10[1]._M_left);
      switch(CVar4) {
      case CPPTYPE_INT32:
        SetInt32(local_80,p_Var10[1]._M_color,*(FieldType *)&p_Var10[1]._M_left,
                 *(int32 *)&p_Var10[1]._M_parent,(FieldDescriptor *)p_Var10[1]._M_right);
        break;
      case CPPTYPE_INT64:
        SetInt64(local_80,p_Var10[1]._M_color,*(FieldType *)&p_Var10[1]._M_left,
                 (int64)p_Var10[1]._M_parent,(FieldDescriptor *)p_Var10[1]._M_right);
        break;
      case CPPTYPE_UINT32:
        SetUInt32(local_80,p_Var10[1]._M_color,*(FieldType *)&p_Var10[1]._M_left,
                  *(uint32 *)&p_Var10[1]._M_parent,(FieldDescriptor *)p_Var10[1]._M_right);
        break;
      case CPPTYPE_UINT64:
        SetUInt64(local_80,p_Var10[1]._M_color,*(FieldType *)&p_Var10[1]._M_left,
                  (uint64)p_Var10[1]._M_parent,(FieldDescriptor *)p_Var10[1]._M_right);
        break;
      case CPPTYPE_DOUBLE:
        SetDouble(local_80,p_Var10[1]._M_color,*(FieldType *)&p_Var10[1]._M_left,
                  (double)p_Var10[1]._M_parent,(FieldDescriptor *)p_Var10[1]._M_right);
        break;
      case CPPTYPE_FLOAT:
        SetFloat(local_80,p_Var10[1]._M_color,*(FieldType *)&p_Var10[1]._M_left,
                 *(float *)&p_Var10[1]._M_parent,(FieldDescriptor *)p_Var10[1]._M_right);
        break;
      case CPPTYPE_BOOL:
        SetBool(local_80,p_Var10[1]._M_color,*(FieldType *)&p_Var10[1]._M_left,
                *(bool *)&p_Var10[1]._M_parent,(FieldDescriptor *)p_Var10[1]._M_right);
        break;
      case CPPTYPE_ENUM:
        SetEnum(local_80,p_Var10[1]._M_color,*(FieldType *)&p_Var10[1]._M_left,
                *(int *)&p_Var10[1]._M_parent,(FieldDescriptor *)p_Var10[1]._M_right);
        break;
      case CPPTYPE_STRING:
        SetString(local_80,p_Var10[1]._M_color,*(FieldType *)&p_Var10[1]._M_left,
                  (string *)p_Var10[1]._M_parent,(FieldDescriptor *)p_Var10[1]._M_right);
        break;
      case CPPTYPE_MESSAGE:
        bVar2 = MaybeNewExtension(local_80,p_Var10[1]._M_color,
                                  (FieldDescriptor *)p_Var10[1]._M_right,&extension);
        pEVar1 = extension;
        if (bVar2) {
          extension->type = *(FieldType *)&p_Var10[1]._M_left;
          extension->is_packed = *(bool *)((long)&p_Var10[1]._M_left + 3);
          extension->is_repeated = false;
          bVar3 = extension->field_0xa & 0xf;
          if (((ulong)p_Var10[1]._M_left & 0x100000) == 0) {
            extension->field_0xa = bVar3;
            pRVar7 = (RepeatedField<int> *)(**(code **)(*(long *)p_Var10[1]._M_parent + 0x18))();
            (pEVar1->field_0).repeated_int32_value = pRVar7;
LAB_00119c05:
            p_Var11 = p_Var10[1]._M_parent;
            piVar12 = pRVar7->elements_;
LAB_00119c0f:
            (**(code **)(piVar12 + 0xe))(pRVar7,p_Var11);
          }
          else {
            extension->field_0xa = bVar3 | 0x10;
            pRVar7 = (RepeatedField<int> *)(**(code **)(*(long *)p_Var10[1]._M_parent + 0x10))();
            (pEVar1->field_0).repeated_int32_value = pRVar7;
            (**(code **)(pRVar7->elements_ + 0x14))(pRVar7,p_Var10[1]._M_parent);
          }
        }
        else {
          if (extension->type != *(FieldType *)&p_Var10[1]._M_left) {
            LogMessage::LogMessage
                      (&local_70,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                       ,0x319);
            pLVar6 = LogMessage::operator<<
                               (&local_70,
                                "CHECK failed: (extension->type) == (other_extension.type): ");
            LogFinisher::operator=(&local_81,pLVar6);
            LogMessage::~LogMessage(&local_70);
          }
          if (pEVar1->is_packed != (bool)*(char *)((long)&p_Var10[1]._M_left + 3)) {
            LogMessage::LogMessage
                      (&local_70,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                       ,0x31a);
            pLVar6 = LogMessage::operator<<
                               (&local_70,
                                "CHECK failed: (extension->is_packed) == (other_extension.is_packed): "
                               );
            LogFinisher::operator=(&local_81,pLVar6);
            LogMessage::~LogMessage(&local_70);
          }
          if (pEVar1->is_repeated == true) {
            LogMessage::LogMessage
                      (&local_70,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/extension_set.cc"
                       ,0x31b);
            pLVar6 = LogMessage::operator<<(&local_70,"CHECK failed: !extension->is_repeated: ");
            LogFinisher::operator=(&local_81,pLVar6);
            LogMessage::~LogMessage(&local_70);
          }
          pRVar7 = (pEVar1->field_0).repeated_int32_value;
          if (((ulong)p_Var10[1]._M_left & 0x100000) == 0) {
            if ((pEVar1->field_0xa & 0x10) != 0) {
              pRVar7 = (RepeatedField<int> *)(**(code **)(pRVar7->elements_ + 8))(pRVar7);
              goto LAB_00119c05;
            }
            (**(code **)(pRVar7->elements_ + 0xe))();
          }
          else {
            if ((pEVar1->field_0xa & 0x10) == 0) {
              p_Var11 = (_Base_ptr)
                        (**(code **)(*(long *)p_Var10[1]._M_parent + 0x18))
                                  (p_Var10[1]._M_parent,pRVar7);
              piVar12 = pRVar7->elements_;
              goto LAB_00119c0f;
            }
            (**(code **)(pRVar7->elements_ + 0x14))(pRVar7);
          }
        }
        pEVar1->field_0xa = pEVar1->field_0xa & 0xf0;
      }
    }
    p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
  } while( true );
}

Assistant:

void ExtensionSet::MergeFrom(const ExtensionSet& other) {
  for (map<int, Extension>::const_iterator iter = other.extensions_.begin();
       iter != other.extensions_.end(); ++iter) {
    const Extension& other_extension = iter->second;

    if (other_extension.is_repeated) {
      Extension* extension;
      bool is_new = MaybeNewExtension(iter->first, other_extension.descriptor,
                                      &extension);
      if (is_new) {
        // Extension did not already exist in set.
        extension->type = other_extension.type;
        extension->is_packed = other_extension.is_packed;
        extension->is_repeated = true;
      } else {
        GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
        GOOGLE_DCHECK_EQ(extension->is_packed, other_extension.is_packed);
        GOOGLE_DCHECK(extension->is_repeated);
      }

      switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, REPEATED_TYPE)             \
        case WireFormatLite::CPPTYPE_##UPPERCASE:                    \
          if (is_new) {                                              \
            extension->repeated_##LOWERCASE##_value =                \
              new REPEATED_TYPE;                                     \
          }                                                          \
          extension->repeated_##LOWERCASE##_value->MergeFrom(        \
            *other_extension.repeated_##LOWERCASE##_value);          \
          break;

        HANDLE_TYPE(  INT32,   int32, RepeatedField   <  int32>);
        HANDLE_TYPE(  INT64,   int64, RepeatedField   <  int64>);
        HANDLE_TYPE( UINT32,  uint32, RepeatedField   < uint32>);
        HANDLE_TYPE( UINT64,  uint64, RepeatedField   < uint64>);
        HANDLE_TYPE(  FLOAT,   float, RepeatedField   <  float>);
        HANDLE_TYPE( DOUBLE,  double, RepeatedField   < double>);
        HANDLE_TYPE(   BOOL,    bool, RepeatedField   <   bool>);
        HANDLE_TYPE(   ENUM,    enum, RepeatedField   <    int>);
        HANDLE_TYPE( STRING,  string, RepeatedPtrField< string>);
#undef HANDLE_TYPE

        case WireFormatLite::CPPTYPE_MESSAGE:
          if (is_new) {
            extension->repeated_message_value =
              new RepeatedPtrField<MessageLite>();
          }
          // We can't call RepeatedPtrField<MessageLite>::MergeFrom() because
          // it would attempt to allocate new objects.
          RepeatedPtrField<MessageLite>* other_repeated_message =
              other_extension.repeated_message_value;
          for (int i = 0; i < other_repeated_message->size(); i++) {
            const MessageLite& other_message = other_repeated_message->Get(i);
            MessageLite* target = extension->repeated_message_value
                     ->AddFromCleared<GenericTypeHandler<MessageLite> >();
            if (target == NULL) {
              target = other_message.New();
              extension->repeated_message_value->AddAllocated(target);
            }
            target->CheckTypeAndMergeFrom(other_message);
          }
          break;
      }
    } else {
      if (!other_extension.is_cleared) {
        switch (cpp_type(other_extension.type)) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE, CAMELCASE)                         \
          case WireFormatLite::CPPTYPE_##UPPERCASE:                          \
            Set##CAMELCASE(iter->first, other_extension.type,                \
                           other_extension.LOWERCASE##_value,                \
                           other_extension.descriptor);                      \
            break;

          HANDLE_TYPE( INT32,  int32,  Int32);
          HANDLE_TYPE( INT64,  int64,  Int64);
          HANDLE_TYPE(UINT32, uint32, UInt32);
          HANDLE_TYPE(UINT64, uint64, UInt64);
          HANDLE_TYPE( FLOAT,  float,  Float);
          HANDLE_TYPE(DOUBLE, double, Double);
          HANDLE_TYPE(  BOOL,   bool,   Bool);
          HANDLE_TYPE(  ENUM,   enum,   Enum);
#undef HANDLE_TYPE
          case WireFormatLite::CPPTYPE_STRING:
            SetString(iter->first, other_extension.type,
                      *other_extension.string_value,
                      other_extension.descriptor);
            break;
          case WireFormatLite::CPPTYPE_MESSAGE: {
            Extension* extension;
            bool is_new = MaybeNewExtension(iter->first,
                                            other_extension.descriptor,
                                            &extension);
            if (is_new) {
              extension->type = other_extension.type;
              extension->is_packed = other_extension.is_packed;
              extension->is_repeated = false;
              if (other_extension.is_lazy) {
                extension->is_lazy = true;
                extension->lazymessage_value =
                    other_extension.lazymessage_value->New();
                extension->lazymessage_value->MergeFrom(
                    *other_extension.lazymessage_value);
              } else {
                extension->is_lazy = false;
                extension->message_value =
                    other_extension.message_value->New();
                extension->message_value->CheckTypeAndMergeFrom(
                    *other_extension.message_value);
              }
            } else {
              GOOGLE_DCHECK_EQ(extension->type, other_extension.type);
              GOOGLE_DCHECK_EQ(extension->is_packed,other_extension.is_packed);
              GOOGLE_DCHECK(!extension->is_repeated);
              if (other_extension.is_lazy) {
                if (extension->is_lazy) {
                  extension->lazymessage_value->MergeFrom(
                      *other_extension.lazymessage_value);
                } else {
                  extension->message_value->CheckTypeAndMergeFrom(
                      other_extension.lazymessage_value->GetMessage(
                          *extension->message_value));
                }
              } else {
                if (extension->is_lazy) {
                  extension->lazymessage_value->MutableMessage(
                      *other_extension.message_value)->CheckTypeAndMergeFrom(
                          *other_extension.message_value);
                } else {
                  extension->message_value->CheckTypeAndMergeFrom(
                      *other_extension.message_value);
                }
              }
            }
            extension->is_cleared = false;
            break;
          }
        }
      }
    }
  }
}